

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O1

int Acb_NtkFindSupp3(Acb_Ntk_t *p,int Pivot,sat_solver *pSat,int nVars,int nDivs,Vec_Int_t *vWin,
                    Vec_Int_t *vSupp,int nLutSize,int fDelay)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  char *__assertion;
  ulong uVar19;
  long lVar20;
  bool bVar21;
  
  if (fDelay != 0) {
    return 0;
  }
  if (Pivot < 1) {
    __assert_fail("i>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                  ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
  }
  if (Pivot < (p->vObjFans).nSize) {
    iVar12 = (p->vObjFans).pArray[(uint)Pivot];
    lVar8 = (long)iVar12;
    if ((-1 < lVar8) && (iVar12 < (p->vFanSto).nSize)) {
      piVar4 = (p->vFanSto).pArray;
      if (0 < piVar4[lVar8]) {
        piVar4 = piVar4 + lVar8;
        iVar12 = nVars * 6 + nDivs;
        lVar8 = 0;
        do {
          uVar1 = piVar4[lVar8 + 1];
          lVar18 = (long)(int)uVar1;
          if (lVar18 < 1) goto LAB_0037cb15;
          if ((p->vObjType).nSize <= (int)uVar1) goto LAB_0037caf6;
          if ((p->vObjType).pArray[lVar18] != '\x03') {
            if ((p->vFanouts).nSize <= (int)uVar1) goto LAB_0037cb34;
            if ((p->vFanouts).pArray[lVar18].nSize == 1) {
              if ((p->vObjFans).nSize <= Pivot) goto LAB_0037c9d6;
              iVar17 = (p->vObjFans).pArray[(uint)Pivot];
              lVar9 = (long)iVar17;
              if ((lVar9 < 0) || ((p->vFanSto).nSize <= iVar17)) goto LAB_0037cab8;
              piVar5 = (p->vFanSto).pArray;
              if (0 < piVar5[lVar9]) {
                piVar5 = piVar5 + lVar9;
                lVar9 = 0;
                do {
                  uVar2 = piVar5[lVar9 + 1];
                  lVar15 = (long)(int)uVar2;
                  if (lVar15 < 1) goto LAB_0037cb15;
                  if ((p->vObjType).nSize <= (int)uVar2) goto LAB_0037caf6;
                  bVar21 = true;
                  if ((p->vObjType).pArray[lVar15] != '\x03') {
                    if ((p->vFanouts).nSize <= (int)uVar2) goto LAB_0037cb34;
                    bVar21 = (p->vFanouts).pArray[lVar15].nSize != 1;
                  }
                  if ((lVar9 != lVar8) && (!bVar21)) {
                    if (uVar1 == uVar2) {
                      __assert_fail("iFanin != iFanin2",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                                    ,0x400,
                                    "int Acb_NtkFindSupp3(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                                   );
                    }
                    vSupp->nSize = 0;
                    if ((p->vObjFans).nSize <= Pivot) goto LAB_0037c9d6;
                    iVar17 = (p->vObjFans).pArray[(uint)Pivot];
                    lVar20 = (long)iVar17;
                    if ((lVar20 < 0) || ((p->vFanSto).nSize <= iVar17)) goto LAB_0037cab8;
                    piVar6 = (p->vFanSto).pArray;
                    if (0 < piVar6[lVar20]) {
                      lVar16 = 0;
                      do {
                        uVar3 = piVar6[lVar20 + lVar16 + 1];
                        if ((uVar3 != uVar1) && (uVar3 != uVar2)) {
                          if ((int)uVar3 < 1) goto LAB_0037c9f5;
                          iVar17 = (p->vObjFunc).nSize;
                          if (iVar17 < 1) goto LAB_0037c9fe;
                          if (iVar17 <= (int)uVar3) goto LAB_0037c9d6;
                          iVar17 = (p->vObjFunc).pArray[uVar3];
                          if (iVar17 < 0) {
                            __assert_fail("Acb_ObjFunc(p, iFanin3) >= 0",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                                          ,0x407,
                                          "int Acb_NtkFindSupp3(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                                         );
                          }
                          iVar17 = iVar17 + nVars * 6;
                          if (iVar17 < 0) goto LAB_0037ca1d;
                          Vec_IntPush(vSupp,iVar17 * 2);
                        }
                        lVar16 = lVar16 + 1;
                      } while (lVar16 < piVar6[lVar20]);
                    }
                    if ((p->vObjFans).nSize <= (int)uVar1) goto LAB_0037c9d6;
                    iVar17 = (p->vObjFans).pArray[lVar18];
                    lVar20 = (long)iVar17;
                    if ((lVar20 < 0) || ((p->vFanSto).nSize <= iVar17)) goto LAB_0037cab8;
                    piVar6 = (p->vFanSto).pArray;
                    if (0 < piVar6[lVar20]) {
                      lVar16 = 0;
                      do {
                        iVar17 = piVar6[lVar20 + lVar16 + 1];
                        if ((long)iVar17 < 1) goto LAB_0037c9f5;
                        iVar7 = (p->vObjFunc).nSize;
                        if (iVar7 < 1) goto LAB_0037c9fe;
                        if (iVar7 <= iVar17) goto LAB_0037c9d6;
                        iVar17 = (p->vObjFunc).pArray[iVar17];
                        if (iVar17 < 0) {
                          __assert_fail("Acb_ObjFunc(p, iFanin3) >= 0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                                        ,0x40f,
                                        "int Acb_NtkFindSupp3(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                                       );
                        }
                        iVar17 = iVar17 + iVar12;
                        if (iVar17 < 0) goto LAB_0037ca1d;
                        lVar16 = lVar16 + 1;
                        Vec_IntPush(vSupp,iVar17 * 2);
                      } while (lVar16 < piVar6[lVar20]);
                    }
                    if ((p->vObjFans).nSize <= (int)uVar2) goto LAB_0037c9d6;
                    iVar17 = (p->vObjFans).pArray[lVar15];
                    lVar15 = (long)iVar17;
                    if ((lVar15 < 0) || ((p->vFanSto).nSize <= iVar17)) goto LAB_0037cab8;
                    piVar6 = (p->vFanSto).pArray;
                    if (0 < piVar6[lVar15]) {
                      piVar6 = piVar6 + lVar15;
                      lVar15 = 0;
                      do {
                        iVar17 = piVar6[lVar15 + 1];
                        if ((long)iVar17 < 1) goto LAB_0037c9f5;
                        iVar7 = (p->vObjFunc).nSize;
                        if (iVar7 < 1) goto LAB_0037c9fe;
                        if (iVar7 <= iVar17) goto LAB_0037c9d6;
                        iVar17 = (p->vObjFunc).pArray[iVar17];
                        if (iVar17 < 0) {
                          __assert_fail("Acb_ObjFunc(p, iFanin3) >= 0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                                        ,0x415,
                                        "int Acb_NtkFindSupp3(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                                       );
                        }
                        iVar17 = iVar17 + iVar12;
                        if (iVar17 < 0) goto LAB_0037ca1d;
                        iVar17 = iVar17 * 2;
                        if (0 < (long)vSupp->nSize) {
                          lVar20 = 0;
                          do {
                            if (vSupp->pArray[lVar20] == iVar17) goto LAB_0037c326;
                            lVar20 = lVar20 + 1;
                          } while (vSupp->nSize != lVar20);
                        }
                        Vec_IntPush(vSupp,iVar17);
LAB_0037c326:
                        lVar15 = lVar15 + 1;
                      } while (lVar15 < *piVar6);
                    }
                    uVar10 = (ulong)vSupp->nSize;
                    if (0 < (long)uVar10) {
                      uVar11 = 1;
                      uVar14 = 0;
                      do {
                        uVar13 = uVar14 + 1;
                        if (uVar13 < uVar10) {
                          uVar19 = uVar11;
                          do {
                            if (vSupp->pArray[uVar14] == vSupp->pArray[uVar19]) {
                              __assert_fail("Vec_IntCheckUniqueSmall(vSupp)",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                                            ,0x418,
                                            "int Acb_NtkFindSupp3(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                                           );
                            }
                            uVar19 = uVar19 + 1;
                          } while (uVar10 != uVar19);
                        }
                        uVar11 = uVar11 + 1;
                        uVar14 = uVar13;
                      } while (uVar13 != uVar10);
                    }
                    iVar17 = sat_solver_solve(pSat,vSupp->pArray,vSupp->pArray + uVar10,0,0,0,0);
                    if (iVar17 == -1) {
                      iVar17 = sat_solver_minimize_assumptions(pSat,vSupp->pArray,vSupp->nSize,0);
                      if (vSupp->nSize < iVar17) goto LAB_0037cb72;
                      vSupp->nSize = iVar17;
                      if (0 < iVar17) {
                        piVar6 = vSupp->pArray;
                        lVar15 = 0;
                        do {
                          uVar2 = piVar6[lVar15];
                          if ((int)uVar2 < 0) goto LAB_0037ca7a;
                          piVar6[lVar15] = (uVar2 >> 1) + nVars * -6;
                          lVar15 = lVar15 + 1;
                        } while (lVar15 < vSupp->nSize);
                      }
                      qsort(vSupp->pArray,(long)vSupp->nSize,4,Vec_IntSortCompare2);
                      iVar17 = vSupp->nSize;
                      if (iVar17 < 1) {
                        iVar7 = 0;
                      }
                      else {
                        piVar6 = vSupp->pArray;
                        lVar15 = 0;
                        iVar7 = 0;
                        do {
                          iVar17 = piVar6[lVar15];
                          if (iVar17 < nDivs) {
                            iVar7 = iVar7 + 1;
                          }
                          else {
                            piVar6[lVar15] = iVar17 - nDivs;
                          }
                          lVar15 = lVar15 + 1;
                          iVar17 = vSupp->nSize;
                        } while (lVar15 < iVar17);
                      }
                      if (iVar7 != 0) {
                        if (iVar7 < 1) {
                          __assert_fail("NodeMark > 0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                                        ,0x431,
                                        "int Acb_NtkFindSupp3(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                                       );
                        }
                        if (iVar17 - iVar7 <= nLutSize) {
                          return iVar7;
                        }
                      }
                    }
                  }
                  lVar9 = lVar9 + 1;
                } while (lVar9 < *piVar5);
              }
            }
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < *piVar4);
      }
      if ((p->vObjFans).nSize <= Pivot) goto LAB_0037c9d6;
      iVar12 = (p->vObjFans).pArray[(uint)Pivot];
      lVar8 = (long)iVar12;
      if ((-1 < lVar8) && (iVar12 < (p->vFanSto).nSize)) {
        piVar4 = (p->vFanSto).pArray;
        if (piVar4[lVar8] < 1) {
          return 0;
        }
        piVar4 = piVar4 + lVar8;
        iVar12 = nVars * 6 + nDivs;
        lVar8 = 0;
        do {
          uVar1 = piVar4[lVar8 + 1];
          lVar18 = (long)(int)uVar1;
          if (lVar18 < 1) {
LAB_0037cb15:
            __assert_fail("i>0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                          ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
          }
          if ((p->vObjType).nSize <= (int)uVar1) {
LAB_0037caf6:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                          ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
          }
          if ((p->vObjType).pArray[lVar18] != '\x03') {
            if ((p->vFanouts).nSize <= (int)uVar1) {
LAB_0037cb34:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWec.h"
                            ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
            }
            if ((p->vFanouts).pArray[lVar18].nSize == 1) {
              if ((p->vObjFans).nSize <= (int)uVar1) goto LAB_0037c9d6;
              iVar17 = (p->vObjFans).pArray[lVar18];
              lVar9 = (long)iVar17;
              if ((lVar9 < 0) || ((p->vFanSto).nSize <= iVar17)) break;
              piVar5 = (p->vFanSto).pArray;
              if (0 < piVar5[lVar9]) {
                piVar5 = piVar5 + lVar9;
                lVar9 = 0;
                do {
                  uVar2 = piVar5[lVar9 + 1];
                  lVar15 = (long)(int)uVar2;
                  if (lVar15 < 1) goto LAB_0037cb15;
                  if ((p->vObjType).nSize <= (int)uVar2) goto LAB_0037caf6;
                  if ((p->vObjType).pArray[lVar15] != '\x03') {
                    if ((p->vFanouts).nSize <= (int)uVar2) goto LAB_0037cb34;
                    if ((p->vFanouts).pArray[lVar15].nSize == 1) {
                      if (uVar1 == uVar2) {
                        __assert_fail("iFanin != iFanin2",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                                      ,0x441,
                                      "int Acb_NtkFindSupp3(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                                     );
                      }
                      vSupp->nSize = 0;
                      if ((p->vObjFans).nSize <= Pivot) goto LAB_0037c9d6;
                      iVar17 = (p->vObjFans).pArray[(uint)Pivot];
                      lVar20 = (long)iVar17;
                      if ((lVar20 < 0) || ((p->vFanSto).nSize <= iVar17)) goto LAB_0037cab8;
                      piVar6 = (p->vFanSto).pArray;
                      if (0 < piVar6[lVar20]) {
                        lVar16 = 0;
                        do {
                          uVar3 = piVar6[lVar20 + lVar16 + 1];
                          if ((uVar3 != uVar1) && (uVar3 != uVar2)) {
                            if ((int)uVar3 < 1) goto LAB_0037c9f5;
                            iVar17 = (p->vObjFunc).nSize;
                            if (iVar17 < 1) goto LAB_0037c9fe;
                            if (iVar17 <= (int)uVar3) goto LAB_0037c9d6;
                            iVar17 = (p->vObjFunc).pArray[uVar3] + nVars * 6;
                            if (iVar17 < 0) goto LAB_0037ca1d;
                            Vec_IntPush(vSupp,iVar17 * 2);
                          }
                          lVar16 = lVar16 + 1;
                        } while (lVar16 < piVar6[lVar20]);
                      }
                      if ((p->vObjFans).nSize <= (int)uVar1) goto LAB_0037c9d6;
                      iVar17 = (p->vObjFans).pArray[lVar18];
                      lVar20 = (long)iVar17;
                      if ((lVar20 < 0) || ((p->vFanSto).nSize <= iVar17)) goto LAB_0037cab8;
                      piVar6 = (p->vFanSto).pArray;
                      if (0 < piVar6[lVar20]) {
                        lVar16 = 0;
                        do {
                          uVar3 = piVar6[lVar20 + lVar16 + 1];
                          if (uVar3 != uVar2) {
                            if ((int)uVar3 < 1) goto LAB_0037c9f5;
                            iVar17 = (p->vObjFunc).nSize;
                            if (iVar17 < 1) goto LAB_0037c9fe;
                            if (iVar17 <= (int)uVar3) goto LAB_0037c9d6;
                            iVar17 = (p->vObjFunc).pArray[uVar3] + iVar12;
                            if (iVar17 < 0) goto LAB_0037ca1d;
                            Vec_IntPush(vSupp,iVar17 * 2);
                          }
                          lVar16 = lVar16 + 1;
                        } while (lVar16 < piVar6[lVar20]);
                      }
                      if ((p->vObjFans).nSize <= (int)uVar2) goto LAB_0037c9d6;
                      iVar17 = (p->vObjFans).pArray[lVar15];
                      lVar15 = (long)iVar17;
                      if ((lVar15 < 0) || ((p->vFanSto).nSize <= iVar17)) goto LAB_0037cab8;
                      piVar6 = (p->vFanSto).pArray;
                      if (0 < piVar6[lVar15]) {
                        piVar6 = piVar6 + lVar15;
                        lVar15 = 0;
                        do {
                          iVar17 = piVar6[lVar15 + 1];
                          if ((long)iVar17 < 1) goto LAB_0037c9f5;
                          iVar7 = (p->vObjFunc).nSize;
                          if (iVar7 < 1) goto LAB_0037c9fe;
                          if (iVar7 <= iVar17) goto LAB_0037c9d6;
                          iVar17 = (p->vObjFunc).pArray[iVar17];
                          if (iVar17 < 0) {
                            __assert_fail("Acb_ObjFunc(p, iFanin3) >= 0",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                                          ,0x451,
                                          "int Acb_NtkFindSupp3(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                                         );
                          }
                          iVar17 = iVar17 + iVar12;
                          if (iVar17 < 0) {
LAB_0037ca1d:
                            __assert_fail("Var >= 0 && !(c >> 1)",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                                          ,0x12e,"int Abc_Var2Lit(int, int)");
                          }
                          iVar17 = iVar17 * 2;
                          if (0 < (long)vSupp->nSize) {
                            lVar20 = 0;
                            do {
                              if (vSupp->pArray[lVar20] == iVar17) goto LAB_0037c82d;
                              lVar20 = lVar20 + 1;
                            } while (vSupp->nSize != lVar20);
                          }
                          Vec_IntPush(vSupp,iVar17);
LAB_0037c82d:
                          lVar15 = lVar15 + 1;
                        } while (lVar15 < *piVar6);
                      }
                      uVar10 = (ulong)vSupp->nSize;
                      if (0 < (long)uVar10) {
                        uVar11 = 1;
                        uVar14 = 0;
                        do {
                          uVar13 = uVar14 + 1;
                          if (uVar13 < uVar10) {
                            uVar19 = uVar11;
                            do {
                              if (vSupp->pArray[uVar14] == vSupp->pArray[uVar19]) {
                                __assert_fail("Vec_IntCheckUniqueSmall(vSupp)",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                                              ,0x454,
                                              "int Acb_NtkFindSupp3(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                                             );
                              }
                              uVar19 = uVar19 + 1;
                            } while (uVar10 != uVar19);
                          }
                          uVar11 = uVar11 + 1;
                          uVar14 = uVar13;
                        } while (uVar13 != uVar10);
                      }
                      iVar17 = sat_solver_solve(pSat,vSupp->pArray,vSupp->pArray + uVar10,0,0,0,0);
                      if (iVar17 != -1) {
                        printf("Failed internal check at node %d.\n",(ulong)(uint)Pivot);
                        __assert_fail("status == l_False",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                                      ,0x45d,
                                      "int Acb_NtkFindSupp3(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                                     );
                      }
                      iVar17 = sat_solver_minimize_assumptions(pSat,vSupp->pArray,vSupp->nSize,0);
                      if (vSupp->nSize < iVar17) {
LAB_0037cb72:
                        __assert_fail("p->nSize >= nSizeNew",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                                      ,0x2b5,"void Vec_IntShrink(Vec_Int_t *, int)");
                      }
                      vSupp->nSize = iVar17;
                      if (0 < iVar17) {
                        piVar6 = vSupp->pArray;
                        lVar15 = 0;
                        do {
                          uVar2 = piVar6[lVar15];
                          if ((int)uVar2 < 0) {
LAB_0037ca7a:
                            __assert_fail("Lit >= 0",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                                          ,0x12f,"int Abc_Lit2Var(int)");
                          }
                          piVar6[lVar15] = (uVar2 >> 1) + nVars * -6;
                          lVar15 = lVar15 + 1;
                        } while (lVar15 < vSupp->nSize);
                      }
                      qsort(vSupp->pArray,(long)vSupp->nSize,4,Vec_IntSortCompare2);
                      iVar17 = vSupp->nSize;
                      if (iVar17 < 1) {
                        iVar7 = 0;
                      }
                      else {
                        piVar6 = vSupp->pArray;
                        lVar15 = 0;
                        iVar7 = 0;
                        do {
                          iVar17 = piVar6[lVar15];
                          if (iVar17 < nDivs) {
                            iVar7 = iVar7 + 1;
                          }
                          else {
                            piVar6[lVar15] = iVar17 - nDivs;
                          }
                          lVar15 = lVar15 + 1;
                          iVar17 = vSupp->nSize;
                        } while (lVar15 < iVar17);
                      }
                      if (iVar7 != 0) {
                        if (iVar7 < 1) {
                          __assert_fail("NodeMark > 0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                                        ,0x46e,
                                        "int Acb_NtkFindSupp3(Acb_Ntk_t *, int, sat_solver *, int, int, Vec_Int_t *, Vec_Int_t *, int, int)"
                                       );
                        }
                        if (iVar17 - iVar7 <= nLutSize) {
                          return iVar7;
                        }
                      }
                    }
                  }
                  lVar9 = lVar9 + 1;
                } while (lVar9 < *piVar5);
              }
            }
          }
          lVar8 = lVar8 + 1;
          if (*piVar4 <= lVar8) {
            return 0;
          }
        } while( true );
      }
    }
LAB_0037cab8:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
LAB_0037c9d6:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
LAB_0037c9f5:
  __assertion = "i>0";
  goto LAB_0037ca05;
LAB_0037c9fe:
  __assertion = "Acb_NtkHasObjFuncs(p)";
LAB_0037ca05:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                ,0x109,"int Acb_ObjFunc(Acb_Ntk_t *, int)");
}

Assistant:

int Acb_NtkFindSupp3( Acb_Ntk_t * p, int Pivot, sat_solver * pSat, int nVars, int nDivs, Vec_Int_t * vWin, Vec_Int_t * vSupp, int nLutSize, int fDelay )
{
    int nSuppNew, status, k, iFanin, * pFanins, k2, iFanin2, * pFanins2, k3, iFanin3, * pFanins3, NodeMark;

    if ( fDelay )
        return 0;

    // iterate through pairs of fanins with one fanouts
    Acb_ObjForEachFaninFast( p, Pivot, pFanins, iFanin, k )
    {
        if ( !Acb_ObjIsAreaCritical(p, iFanin) )
            continue;
        Acb_ObjForEachFaninFast( p, Pivot, pFanins2, iFanin2, k2 )
        {
            if ( !Acb_ObjIsAreaCritical(p, iFanin2) || k2 == k )
                continue;
            // iFanin and iFanin2 have 1 fanout
            assert( iFanin != iFanin2 );

            // collect fanins of the root node
            Vec_IntClear( vSupp );
            Acb_ObjForEachFaninFast( p, Pivot, pFanins3, iFanin3, k3 )
                if ( iFanin3 != iFanin && iFanin3 != iFanin2 )
                {
                    assert( Acb_ObjFunc(p, iFanin3) >= 0 );
                    Vec_IntPush( vSupp, Abc_Var2Lit(Acb_ObjFunc(p, iFanin3) + 6*nVars, 0) );
                }
            NodeMark = Vec_IntSize(vSupp);

            // collect fanins of the second node
            Acb_ObjForEachFaninFast( p, iFanin, pFanins3, iFanin3, k3 )
            {
                assert( Acb_ObjFunc(p, iFanin3) >= 0 );
                Vec_IntPush( vSupp, Abc_Var2Lit(Acb_ObjFunc(p, iFanin3) + 6*nVars + nDivs, 0) );
            }
            // collect fanins of the third node
            Acb_ObjForEachFaninFast( p, iFanin2, pFanins3, iFanin3, k3 )
            {
                assert( Acb_ObjFunc(p, iFanin3) >= 0 );
                Vec_IntPushUnique( vSupp, Abc_Var2Lit(Acb_ObjFunc(p, iFanin3) + 6*nVars + nDivs, 0) );
            }
            assert( Vec_IntCheckUniqueSmall(vSupp) );

            // sort fanins by level
            //Vec_IntSelectSortCost( Vec_IntArray(vSupp) + NodeMark, Vec_IntSize(vSupp) - NodeMark, &p->vLevelD );
            // solve for these fanins
            status = sat_solver_solve( pSat, Vec_IntArray(vSupp), Vec_IntLimit(vSupp), 0, 0, 0, 0 );
            if ( status != l_False )
                continue;
            assert( status == l_False );
            nSuppNew = sat_solver_minimize_assumptions( pSat, Vec_IntArray(vSupp), Vec_IntSize(vSupp), 0 );
            Vec_IntShrink( vSupp, nSuppNew );
            Vec_IntLits2Vars( vSupp, -6*nVars );
            Vec_IntSort( vSupp, 1 );
            // count how many belong to H; the rest belong to G
            NodeMark = 0;
            Vec_IntForEachEntry( vSupp, iFanin3, k3 )
                if ( iFanin3 >= nDivs )
                    Vec_IntWriteEntry( vSupp, k3, iFanin3 - nDivs );
                else 
                    NodeMark++;
            if ( NodeMark == 0 )
            {
                //printf( "Obj %d: Special case 1 (vars = %d)\n", Pivot, Vec_IntSize(vSupp) );
                continue;
            }
            assert( NodeMark > 0 );
            if ( Vec_IntSize(vSupp) - NodeMark <= nLutSize )
                return NodeMark;
        }
    }

    // iterate through fanins with one fanout and their fanins with one fanout
    Acb_ObjForEachFaninFast( p, Pivot, pFanins, iFanin, k )
    {
        if ( !Acb_ObjIsAreaCritical(p, iFanin) )
            continue;
        Acb_ObjForEachFaninFast( p, iFanin, pFanins2, iFanin2, k2 )
        {
            if ( !Acb_ObjIsAreaCritical(p, iFanin2) )
                continue;
            // iFanin and iFanin2 have 1 fanout
            assert( iFanin != iFanin2 );

            // collect fanins of the root node
            Vec_IntClear( vSupp );
            Acb_ObjForEachFaninFast( p, Pivot, pFanins3, iFanin3, k3 )
                if ( iFanin3 != iFanin && iFanin3 != iFanin2 )
                    Vec_IntPush( vSupp, Abc_Var2Lit(Acb_ObjFunc(p, iFanin3) + 6*nVars, 0) );
            NodeMark = Vec_IntSize(vSupp);

            // collect fanins of the second node
            Acb_ObjForEachFaninFast( p, iFanin, pFanins3, iFanin3, k3 )
                if ( iFanin3 != iFanin2 )
                    Vec_IntPush( vSupp, Abc_Var2Lit(Acb_ObjFunc(p, iFanin3) + 6*nVars + nDivs, 0) );
            // collect fanins of the third node
            Acb_ObjForEachFaninFast( p, iFanin2, pFanins3, iFanin3, k3 )
            {
                assert( Acb_ObjFunc(p, iFanin3) >= 0 );
                Vec_IntPushUnique( vSupp, Abc_Var2Lit(Acb_ObjFunc(p, iFanin3) + 6*nVars + nDivs, 0) );
            }
            assert( Vec_IntCheckUniqueSmall(vSupp) );

            // sort fanins by level
            //Vec_IntSelectSortCost( Vec_IntArray(vSupp) + NodeMark, Vec_IntSize(vSupp) - NodeMark, &p->vLevelD );
            //Sat_SolverWriteDimacs( pSat, NULL, Vec_IntArray(vSupp), Vec_IntLimit(vSupp), 0 );
            // solve for these fanins
            status = sat_solver_solve( pSat, Vec_IntArray(vSupp), Vec_IntLimit(vSupp), 0, 0, 0, 0 );
            if ( status != l_False )
                printf( "Failed internal check at node %d.\n", Pivot );
            assert( status == l_False );
            nSuppNew = sat_solver_minimize_assumptions( pSat, Vec_IntArray(vSupp), Vec_IntSize(vSupp), 0 );
            Vec_IntShrink( vSupp, nSuppNew );
            Vec_IntLits2Vars( vSupp, -6*nVars );
            Vec_IntSort( vSupp, 1 );
            // count how many belong to H; the rest belong to G
            NodeMark = 0;
            Vec_IntForEachEntry( vSupp, iFanin3, k3 )
                if ( iFanin3 >= nDivs )
                    Vec_IntWriteEntry( vSupp, k3, iFanin3 - nDivs );
                else 
                    NodeMark++;
            if ( NodeMark == 0 )
            {
                //printf( "Obj %d: Special case 2 (vars = %d)\n", Pivot, Vec_IntSize(vSupp) );
                continue;
            }
            assert( NodeMark > 0 );
            if ( Vec_IntSize(vSupp) - NodeMark <= nLutSize )
                return NodeMark;
        }
    }

    return 0;
}